

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O3

void __thiscall SqlGenerator::generateOutputQueries(SqlGenerator *this)

{
  ulong uVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  size_t sVar5;
  View *pVVar6;
  Attribute *pAVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  ulong uVar11;
  size_type *psVar12;
  undefined8 *puVar13;
  size_t var;
  ulong uVar14;
  char cVar15;
  ulong v_id;
  string __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string orderby;
  string __str_2;
  ofstream ofs;
  ulong *local_338;
  long local_330;
  ulong local_328;
  undefined8 uStack_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  ulong *local_2f8;
  uint local_2f0;
  undefined4 uStack_2ec;
  ulong local_2e8 [2];
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined8 *local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  SqlGenerator *local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_258 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002d84a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_2b8);
  std::ofstream::ofstream(&local_230,(string *)&local_2b8,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  v_id = 0;
  do {
    sVar5 = QueryCompiler::numberOfViews
                      ((local_258->_qc).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar5 <= v_id) {
      std::ofstream::close();
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      return;
    }
    pVVar6 = QueryCompiler::getView
                       ((local_258->_qc).
                        super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,v_id);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
    uVar14 = 0;
    do {
      if (((pVVar6->_fVars).super__Base_bitset<2UL>._M_w[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)
      {
        pAVar7 = TreeDecomposition::getAttribute
                           ((local_258->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar14);
        local_298[0] = local_288;
        pcVar2 = (pAVar7->_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar2,pcVar2 + (pAVar7->_name)._M_string_length);
        std::__cxx11::string::append((char *)local_298);
        std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298[0]);
        if (local_298[0] != local_288) {
          operator_delete(local_298[0]);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 100);
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
    if (local_2b8._M_string_length != 0) {
      std::operator+(&local_318," ORDER BY ",&local_2b8);
      std::__cxx11::string::_M_append((char *)local_298,(ulong)local_318._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p);
      }
      std::__cxx11::string::pop_back();
    }
    if ((pVVar6->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pVVar6->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar14 = 0;
      do {
        cVar15 = '\x01';
        if (9 < v_id) {
          uVar11 = v_id;
          cVar4 = '\x04';
          do {
            cVar15 = cVar4;
            if (uVar11 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_0029a275;
            }
            if (uVar11 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_0029a275;
            }
            if (uVar11 < 10000) goto LAB_0029a275;
            bVar3 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar4 = cVar15 + '\x04';
          } while (bVar3);
          cVar15 = cVar15 + '\x01';
        }
LAB_0029a275:
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_250,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_250._M_dataplus._M_p,(uint)local_250._M_string_length,v_id);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x2b1c6e);
        local_2d8 = &local_2c8;
        puVar10 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar10) {
          local_2c8 = *puVar10;
          lStack_2c0 = plVar8[3];
        }
        else {
          local_2c8 = *puVar10;
          local_2d8 = (ulong *)*plVar8;
        }
        local_2d0 = plVar8[1];
        *plVar8 = (long)puVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
        local_338 = &local_328;
        puVar10 = puVar9 + 2;
        if ((ulong *)*puVar9 == puVar10) {
          local_328 = *puVar10;
          uStack_320 = puVar9[3];
        }
        else {
          local_328 = *puVar10;
          local_338 = (ulong *)*puVar9;
        }
        local_330 = puVar9[1];
        *puVar9 = puVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        cVar15 = '\x01';
        if (9 < uVar14) {
          uVar11 = uVar14;
          cVar4 = '\x04';
          do {
            cVar15 = cVar4;
            if (uVar11 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_0029a3b4;
            }
            if (uVar11 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_0029a3b4;
            }
            if (uVar11 < 10000) goto LAB_0029a3b4;
            bVar3 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar4 = cVar15 + '\x04';
          } while (bVar3);
          cVar15 = cVar15 + '\x01';
        }
LAB_0029a3b4:
        local_2f8 = local_2e8;
        std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,local_2f0,uVar14);
        uVar11 = 0xf;
        if (local_338 != &local_328) {
          uVar11 = local_328;
        }
        uVar1 = CONCAT44(uStack_2ec,local_2f0) + local_330;
        if (uVar11 < uVar1) {
          uVar11 = 0xf;
          if (local_2f8 != local_2e8) {
            uVar11 = local_2e8[0];
          }
          if (uVar11 < uVar1) goto LAB_0029a426;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_338);
        }
        else {
LAB_0029a426:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2f8);
        }
        puVar13 = puVar9 + 2;
        if ((undefined8 *)*puVar9 == puVar13) {
          local_268 = *puVar13;
          uStack_260 = puVar9[3];
          local_278 = &local_268;
        }
        else {
          local_268 = *puVar13;
          local_278 = (undefined8 *)*puVar9;
        }
        local_270 = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)puVar13 = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318.field_2._8_8_ = plVar8[3];
        }
        else {
          local_318.field_2._M_allocated_capacity = *psVar12;
          local_318._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_318._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_318._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278);
        }
        if (local_2f8 != local_2e8) {
          operator_delete(local_2f8);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)(pVVar6->_aggregates).
                                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)(pVVar6->_aggregates).
                                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::__cxx11::string::pop_back();
    std::operator+(&local_250,"\\COPY (SELECT ",&local_2b8);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
    local_2d8 = &local_2c8;
    puVar10 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar10) {
      local_2c8 = *puVar10;
      lStack_2c0 = puVar9[3];
    }
    else {
      local_2c8 = *puVar10;
      local_2d8 = (ulong *)*puVar9;
    }
    local_2d0 = puVar9[1];
    *puVar9 = puVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    cVar15 = '\x01';
    if (9 < v_id) {
      uVar14 = v_id;
      cVar4 = '\x04';
      do {
        cVar15 = cVar4;
        if (uVar14 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0029a664;
        }
        if (uVar14 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0029a664;
        }
        if (uVar14 < 10000) goto LAB_0029a664;
        bVar3 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar4 = cVar15 + '\x04';
      } while (bVar3);
      cVar15 = cVar15 + '\x01';
    }
LAB_0029a664:
    local_2f8 = local_2e8;
    std::__cxx11::string::_M_construct((ulong)&local_2f8,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2f8,local_2f0,v_id);
    uVar14 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar14 = local_2c8;
    }
    uVar11 = CONCAT44(uStack_2ec,local_2f0) + local_2d0;
    if (uVar14 < uVar11) {
      uVar14 = 0xf;
      if (local_2f8 != local_2e8) {
        uVar14 = local_2e8[0];
      }
      if (uVar14 < uVar11) goto LAB_0029a6d7;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_0029a6d7:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_2f8);
    }
    local_338 = &local_328;
    puVar10 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar10) {
      local_328 = *puVar10;
      uStack_320 = puVar9[3];
    }
    else {
      local_328 = *puVar10;
      local_338 = (ulong *)*puVar9;
    }
    local_330 = puVar9[1];
    *puVar9 = puVar10;
    puVar9[1] = 0;
    *(undefined1 *)puVar10 = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_298[0]);
    puVar13 = puVar9 + 2;
    if ((undefined8 *)*puVar9 == puVar13) {
      local_268 = *puVar13;
      uStack_260 = puVar9[3];
      local_278 = &local_268;
    }
    else {
      local_268 = *puVar13;
      local_278 = (undefined8 *)*puVar9;
    }
    local_270 = puVar9[1];
    *puVar9 = puVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    psVar12 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_318.field_2._M_allocated_capacity = *psVar12;
      local_318.field_2._8_8_ = puVar9[3];
    }
    else {
      local_318.field_2._M_allocated_capacity = *psVar12;
      local_318._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_318._M_string_length = puVar9[1];
    *puVar9 = psVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,local_318._M_dataplus._M_p,local_318._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338);
    }
    if (local_2f8 != local_2e8) {
      operator_delete(local_2f8);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    if (local_298[0] != local_288) {
      operator_delete(local_298[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    v_id = v_id + 1;
  } while( true );
}

Assistant:

void SqlGenerator::generateOutputQueries()
{
    ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/output.sql");
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += attr->_name+",";
            }
        }
        std::string orderby = "";
        if (!fields.empty())
        {
            orderby += " ORDER BY "+fields;
            orderby.pop_back();
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += "CAST(agg_"+std::to_string(viewID)+"_"+std::to_string(agg)+
                " AS decimal(53,2)),";

        fields.pop_back();
        
        ofs << "\\COPY (SELECT "+fields+" FROM view_"+to_string(viewID)+orderby+
            ") TO PROGRAM \'cat - >> test.out\' CSV DELIMITER \'|\';\n\n";
    }
    ofs.close();
}